

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

int * __thiscall amrex::BaseFab<int>::dataPtr(BaseFab<int> *this,int n)

{
  long lVar1;
  Long LVar2;
  int in_ESI;
  Box *in_RDI;
  int *local_8;
  
  if (*(long *)((in_RDI->bigend).vect + 1) == 0) {
    local_8 = (int *)0x0;
  }
  else {
    lVar1 = *(long *)((in_RDI->bigend).vect + 1);
    LVar2 = Box::numPts(in_RDI);
    local_8 = (int *)(lVar1 + in_ESI * LVar2 * 4);
  }
  return local_8;
}

Assistant:

T* dataPtr (int n = 0) noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }